

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpDiscovery.c
# Opt level: O1

int UpnpDiscovery_assign(UpnpDiscovery *p,UpnpDiscovery *q)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  sockaddr_storage *psVar10;
  sockaddr_storage *psVar11;
  bool bVar12;
  byte bVar13;
  
  bVar13 = 0;
  if (p == q) {
    return 1;
  }
  p->m_ErrCode = q->m_ErrCode;
  p->m_Expires = q->m_Expires;
  pcVar8 = UpnpString_get_String(q->m_DeviceID);
  iVar7 = UpnpString_set_String(p->m_DeviceID,pcVar8);
  if (iVar7 != 0) {
    pcVar8 = UpnpString_get_String(q->m_DeviceType);
    iVar7 = UpnpString_set_String(p->m_DeviceType,pcVar8);
    if (iVar7 != 0) {
      pcVar8 = UpnpString_get_String(q->m_ServiceType);
      iVar7 = UpnpString_set_String(p->m_ServiceType,pcVar8);
      if (iVar7 != 0) {
        pcVar8 = UpnpString_get_String(q->m_ServiceVer);
        iVar7 = UpnpString_set_String(p->m_ServiceVer,pcVar8);
        if (iVar7 != 0) {
          pcVar8 = UpnpString_get_String(q->m_Location);
          iVar7 = UpnpString_set_String(p->m_Location,pcVar8);
          if (iVar7 != 0) {
            pcVar8 = UpnpString_get_String(q->m_Os);
            iVar7 = UpnpString_set_String(p->m_Os,pcVar8);
            if (iVar7 != 0) {
              pcVar8 = UpnpString_get_String(q->m_Date);
              iVar7 = UpnpString_set_String(p->m_Date,pcVar8);
              if (iVar7 != 0) {
                pcVar8 = UpnpString_get_String(q->m_Ext);
                iVar7 = UpnpString_set_String(p->m_Ext,pcVar8);
                bVar12 = iVar7 != 0;
                goto LAB_00120b1f;
              }
            }
          }
        }
      }
    }
  }
  bVar12 = false;
LAB_00120b1f:
  if (bVar12 != false) {
    psVar10 = &q->m_DestAddr;
    psVar11 = &p->m_DestAddr;
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      cVar1 = psVar10->__ss_padding[0];
      cVar2 = psVar10->__ss_padding[1];
      cVar3 = psVar10->__ss_padding[2];
      cVar4 = psVar10->__ss_padding[3];
      cVar5 = psVar10->__ss_padding[4];
      cVar6 = psVar10->__ss_padding[5];
      psVar11->ss_family = psVar10->ss_family;
      psVar11->__ss_padding[0] = cVar1;
      psVar11->__ss_padding[1] = cVar2;
      psVar11->__ss_padding[2] = cVar3;
      psVar11->__ss_padding[3] = cVar4;
      psVar11->__ss_padding[4] = cVar5;
      psVar11->__ss_padding[5] = cVar6;
      psVar10 = (sockaddr_storage *)((long)psVar10 + (ulong)bVar13 * -0x10 + 8);
      psVar11 = (sockaddr_storage *)((long)psVar11 + (ulong)bVar13 * -0x10 + 8);
    }
  }
  return (uint)bVar12;
}

Assistant:

int UpnpDiscovery_assign(UpnpDiscovery *p, const UpnpDiscovery *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     UpnpDiscovery_set_ErrCode(p, UpnpDiscovery_get_ErrCode(q));
		ok = ok &&
		     UpnpDiscovery_set_Expires(p, UpnpDiscovery_get_Expires(q));
		ok = ok && UpnpDiscovery_set_DeviceID(
				   p, UpnpDiscovery_get_DeviceID(q));
		ok = ok && UpnpDiscovery_set_DeviceType(
				   p, UpnpDiscovery_get_DeviceType(q));
		ok = ok && UpnpDiscovery_set_ServiceType(
				   p, UpnpDiscovery_get_ServiceType(q));
		ok = ok && UpnpDiscovery_set_ServiceVer(
				   p, UpnpDiscovery_get_ServiceVer(q));
		ok = ok && UpnpDiscovery_set_Location(
				   p, UpnpDiscovery_get_Location(q));
		ok = ok && UpnpDiscovery_set_Os(p, UpnpDiscovery_get_Os(q));
		ok = ok && UpnpDiscovery_set_Date(p, UpnpDiscovery_get_Date(q));
		ok = ok && UpnpDiscovery_set_Ext(p, UpnpDiscovery_get_Ext(q));
		ok = ok && UpnpDiscovery_set_DestAddr(
				   p, UpnpDiscovery_get_DestAddr(q));
	}

	return ok;
}